

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imstb_textedit.h
# Opt level: O0

void ImGuiStb::stb_text_redo(ImGuiInputTextState *str,STB_TexteditState *state)

{
  ImWchar IVar1;
  int *in_RSI;
  ImGuiInputTextState *in_RDI;
  int i;
  StbUndoRecord r;
  StbUndoRecord *u;
  StbUndoState *s;
  int idx;
  ImGuiInputTextState *obj;
  undefined8 uVar2;
  ImGuiInputTextState *obj_00;
  ImWchar *new_text;
  
  new_text = (ImWchar *)(in_RSI + 6);
  if ((short)in_RSI[0x386] != 99) {
    obj_00 = (ImGuiInputTextState *)(new_text + (long)*(short *)((long)in_RSI + 0xe16) * 8);
    obj = *(ImGuiInputTextState **)(new_text + (long)(short)in_RSI[0x386] * 8);
    uVar2 = *(undefined8 *)(new_text + (long)(short)in_RSI[0x386] * 8 + 4);
    (obj_00->TextW).Size = (int)((ulong)obj >> 0x20);
    *(int *)&obj_00->field_0x4 = (int)uVar2;
    obj_00->ID = (ImGuiID)obj;
    (obj_00->TextW).Capacity = -1;
    if ((int)uVar2 != 0) {
      if (in_RSI[0x388] < in_RSI[0x387] + *(int *)&obj_00->field_0x4) {
        *(undefined4 *)&obj_00->field_0x4 = 0;
        (obj_00->TextW).Size = 0;
      }
      else {
        (obj_00->TextW).Capacity = in_RSI[0x387];
        in_RSI[0x387] = in_RSI[0x387] + *(int *)&obj_00->field_0x4;
        for (idx = 0; idx < *(int *)&obj_00->field_0x4; idx = idx + 1) {
          IVar1 = STB_TEXTEDIT_GETCHAR(obj,idx);
          new_text[(long)((obj_00->TextW).Capacity + idx) + 0x318] = IVar1;
        }
      }
      STB_TEXTEDIT_DELETECHARS(obj_00,(int)((ulong)uVar2 >> 0x20),(int)uVar2);
    }
    if ((int)((ulong)obj >> 0x20) != 0) {
      STB_TEXTEDIT_INSERTCHARS
                (in_RDI,(int)((ulong)in_RSI >> 0x20),new_text,(int)((ulong)obj_00 >> 0x20));
      *(int *)(new_text + 0x704) = (int)((ulong)obj >> 0x20) + *(int *)(new_text + 0x704);
    }
    *in_RSI = (int)obj + (int)((ulong)obj >> 0x20);
    new_text[0x6ff] = new_text[0x6ff] + 1;
    new_text[0x700] = new_text[0x700] + 1;
  }
  return;
}

Assistant:

static void stb_text_redo(STB_TEXTEDIT_STRING *str, STB_TexteditState *state)
{
   StbUndoState *s = &state->undostate;
   StbUndoRecord *u, r;
   if (s->redo_point == STB_TEXTEDIT_UNDOSTATECOUNT)
      return;

   // we need to do two things: apply the redo record, and create an undo record
   u = &s->undo_rec[s->undo_point];
   r = s->undo_rec[s->redo_point];

   // we KNOW there must be room for the undo record, because the redo record
   // was derived from an undo record

   u->delete_length = r.insert_length;
   u->insert_length = r.delete_length;
   u->where = r.where;
   u->char_storage = -1;

   if (r.delete_length) {
      // the redo record requires us to delete characters, so the undo record
      // needs to store the characters

      if (s->undo_char_point + u->insert_length > s->redo_char_point) {
         u->insert_length = 0;
         u->delete_length = 0;
      } else {
         int i;
         u->char_storage = s->undo_char_point;
         s->undo_char_point = s->undo_char_point + u->insert_length;

         // now save the characters
         for (i=0; i < u->insert_length; ++i)
            s->undo_char[u->char_storage + i] = STB_TEXTEDIT_GETCHAR(str, u->where + i);
      }

      STB_TEXTEDIT_DELETECHARS(str, r.where, r.delete_length);
   }

   if (r.insert_length) {
      // easy case: need to insert n characters
      STB_TEXTEDIT_INSERTCHARS(str, r.where, &s->undo_char[r.char_storage], r.insert_length);
      s->redo_char_point += r.insert_length;
   }

   state->cursor = r.where + r.insert_length;

   s->undo_point++;
   s->redo_point++;
}